

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O2

Value * __thiscall flow::IRBuilder::createNot(IRBuilder *this,Value *rhs,string *name)

{
  long lVar1;
  ConstantInt *pCVar2;
  UnaryInstr<(flow::UnaryOperator)1,_(flow::LiteralType)2> *pUVar3;
  Value *local_40;
  string local_38;
  
  local_40 = rhs;
  if (rhs->type_ != Number) {
    __assert_fail("rhs->type() == LiteralType::Number",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                  ,0xb2,"Value *flow::IRBuilder::createNot(Value *, const std::string &)");
  }
  lVar1 = __dynamic_cast(rhs,&Value::typeinfo,&ConstantValue<long,(flow::LiteralType)2>::typeinfo,0)
  ;
  if (lVar1 != 0) {
    pCVar2 = get(this,~*(ulong *)(lVar1 + 0x48));
    return (Value *)pCVar2;
  }
  makeName(&local_38,this,name);
  pUVar3 = insert<flow::UnaryInstr<(flow::UnaryOperator)1,(flow::LiteralType)2>,flow::Value*&,std::__cxx11::string>
                     (this,&local_40,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (Value *)pUVar3;
}

Assistant:

Value* IRBuilder::createNot(Value* rhs, const std::string& name) {
  assert(rhs->type() == LiteralType::Number);

  if (auto a = dynamic_cast<ConstantInt*>(rhs))
    return get(~a->get());

  return insert<INotInstr>(rhs, makeName(name));
}